

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O0

void __thiscall HTTPReplySender::start_thread(HTTPReplySender *this)

{
  TadsMessageQueue *pTVar1;
  int iVar2;
  CVmWeakRef *pCVar3;
  undefined4 extraout_var;
  vm_globalvar_t *pvVar4;
  void *__child_stack;
  _func_int **__fn;
  CVmWeakRefable *in_RDI;
  void *in_R8;
  HTTPReplySenderThread *t;
  vm_httpreq_cookie *ocookies;
  char *ocont_type;
  char *ostatus;
  HTTPReplySender *in_stack_ffffffffffffffc8;
  CVmObjTable *in_stack_ffffffffffffffd0;
  vm_httpreq_cookie *this_00;
  int sock_err;
  HTTPReplySender *this_01;
  
  in_RDI->mu = (OS_Mutex *)0x0;
  pTVar1 = G_net_queue_X;
  in_RDI->weakref = (CVmWeakRef *)G_net_queue_X;
  if (pTVar1 != (TadsMessageQueue *)0x0) {
    CVmRefCntObj::add_ref((CVmRefCntObj *)0x25a0bd);
  }
  this_01 = (HTTPReplySender *)in_RDI[1].weakref;
  in_RDI[1].weakref = (CVmWeakRef *)0x0;
  sock_err = (int)((ulong)in_RDI[2].weakref >> 0x20);
  in_RDI[2].weakref = (CVmWeakRef *)0x0;
  this_00 = (vm_httpreq_cookie *)in_RDI[3].super_CVmRefCntObj.cnt.cnt.super___atomic_base<long>._M_i
  ;
  in_RDI[3].super_CVmRefCntObj.cnt.cnt.super___atomic_base<long>._M_i = 0;
  *(undefined4 *)&in_RDI[3].mu = 1;
  pCVar3 = (CVmWeakRef *)lib_copy_str((char *)in_stack_ffffffffffffffc8,(size_t)in_RDI);
  in_RDI[1].weakref = pCVar3;
  __fn = in_RDI[3].super_CVmRefCntObj._vptr_CVmRefCntObj;
  pCVar3 = (CVmWeakRef *)lib_copy_str((char *)in_stack_ffffffffffffffc8,(size_t)in_RDI);
  in_RDI[2].weakref = pCVar3;
  if (this_00 != (vm_httpreq_cookie *)0x0) {
    iVar2 = vm_httpreq_cookie::clone(this_00,(__fn *)__fn,__child_stack,(int)pCVar3,in_R8);
    in_RDI[3].super_CVmRefCntObj.cnt.cnt.super___atomic_base<long>._M_i =
         CONCAT44(extraout_var,iVar2);
  }
  bodyArg::init_async((bodyArg *)in_stack_ffffffffffffffd0);
  pvVar4 = CVmObjTable::create_global_var(in_stack_ffffffffffffffd0);
  in_RDI[1].super_CVmRefCntObj.cnt.cnt.super___atomic_base<long>._M_i = (__int_type)pvVar4;
  vm_val_t::set_obj((vm_val_t *)in_RDI[1].super_CVmRefCntObj.cnt.cnt.super___atomic_base<long>._M_i,
                    *(vm_obj_id_t *)&in_RDI[1].super_CVmRefCntObj._vptr_CVmRefCntObj);
  operator_new(0x48);
  HTTPReplySenderThread::HTTPReplySenderThread
            ((HTTPReplySenderThread *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  iVar2 = OS_Thread::launch((OS_Thread *)in_stack_ffffffffffffffc8);
  if (iVar2 == 0) {
    post_done_event(this_01,sock_err,(char *)this_00);
  }
  CVmWeakRefable::release_ref(in_RDI);
  return;
}

Assistant:

void start_thread(VMG0_)
    {
        /* save the globals for use in the 'done' event */
        vmg = VMGLOB_ADDR;

        /* remember the net event queue, and record our reference on it */
        if ((queue = G_net_queue) != 0)
            queue->add_ref();

        /* 
         *   remove the original parametres from our member variables before
         *   we set async mode, in case we throw an error in the course of
         *   making copies - we wouldn't want to delete the originals, as
         *   those are owned by the main thread
         */
        const char *ostatus = status; status = 0;
        const char *ocont_type = cont_type; cont_type = 0;
        vm_httpreq_cookie *ocookies = cookies; cookies = 0;

        /* note that we're now in async mode */
        async = TRUE;
        
        /* install copies in our member variables */
        status = lib_copy_str(ostatus, status_len);
        cont_type = lib_copy_str(ocont_type, cont_type_len);
        if (ocookies != 0)
            cookies = ocookies->clone();

        /* initialize async mode in the body object */
        body->init_async(vmg0_);

        /* 
         *   create a global variable for the request object ID, to keep it
         *   around until the request is completed 
         */
        reqvar = G_obj_table->create_global_var();
        reqvar->val.set_obj(reqid);

        /* create and launch a thread to handle the data transfer */
        HTTPReplySenderThread *t = new HTTPReplySenderThread(this);
        if (!t->launch())
        {
            /* 
             *   the thread failed - post a 'finished' event with an error,
             *   since the thread can't do this on its own if it never runs
             */
            post_done_event(0, "unable to launch thread");
        }

        /* we're done with the thread */
        t->release_ref();
    }